

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O0

size_t __thiscall jessilib::thread_pool::active(thread_pool *this)

{
  size_t sVar1;
  size_type sVar2;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> guard;
  thread_pool *this_local;
  
  guard._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->m_inactive_threads_mutex);
  sVar1 = threads(this);
  sVar2 = std::
          queue<jessilib::thread_pool::thread_*,_std::deque<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>_>
          ::size(&this->m_inactive_threads);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return sVar1 - sVar2;
}

Assistant:

size_t thread_pool::active() const {
	std::lock_guard<std::mutex> guard(m_inactive_threads_mutex);
	return threads() - m_inactive_threads.size();
}